

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.h
# Opt level: O3

bool leveldb::ConsumeDecimalNumber(Slice *in,uint64_t *val)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  ulong uVar7;
  size_t sVar8;
  long in_FS_OFFSET;
  bool bVar9;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar4 = (byte *)in->data_;
  sVar8 = in->size_;
  if (sVar8 == 0) {
    uVar7 = 0;
    pbVar6 = pbVar4;
  }
  else {
    pbVar1 = pbVar4 + sVar8;
    uVar7 = 0;
    pbVar5 = pbVar4;
    do {
      bVar2 = *pbVar5;
      pbVar6 = pbVar5;
      if ((byte)(bVar2 - 0x3a) < 0xf6) break;
      if ((0x1999999999999999 < uVar7) || (uVar7 == 0x1999999999999999 && 0x35 < bVar2)) {
        bVar9 = false;
        goto LAB_00d2e923;
      }
      uVar7 = (ulong)(bVar2 & 0xf) + uVar7 * 10;
      pbVar5 = pbVar5 + 1;
      sVar8 = sVar8 - 1;
      pbVar6 = pbVar1;
    } while (sVar8 != 0);
  }
  *val = uVar7;
  uVar7 = (long)pbVar6 - (long)pbVar4;
  if (in->size_ < uVar7) {
    __assert_fail("n <= size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/include/leveldb/slice.h"
                  ,0x46,"void leveldb::Slice::remove_prefix(size_t)");
  }
  in->data_ = (char *)(pbVar4 + uVar7);
  in->size_ = in->size_ - uVar7;
  bVar9 = pbVar6 != pbVar4;
LAB_00d2e923:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

size_t size() const { return size_; }